

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

cbtBroadphaseProxy * __thiscall
cbtAxisSweep3Internal<unsigned_int>::createProxy
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          int shapeType,void *userPtr,int collisionFilterGroup,int collisionFilterMask,
          cbtDispatcher *dispatcher)

{
  Handle *pHVar1;
  cbtDbvtBroadphase *pcVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  
  uVar3 = addHandle(this,aabbMin,aabbMax,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher
                   );
  pHVar1 = this->m_pHandles;
  pcVar2 = this->m_raycastAccelerator;
  if (pcVar2 != (cbtDbvtBroadphase *)0x0) {
    iVar4 = (*(pcVar2->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[2])
                      (pcVar2,aabbMin,aabbMax,(ulong)(uint)shapeType,userPtr,collisionFilterGroup,
                       (ulong)(uint)collisionFilterMask,dispatcher);
    pHVar1[uVar3].m_dbvtProxy = (cbtBroadphaseProxy *)CONCAT44(extraout_var,iVar4);
  }
  return &pHVar1[uVar3].super_cbtBroadphaseProxy;
}

Assistant:

cbtBroadphaseProxy* cbtAxisSweep3Internal<BP_FP_INT_TYPE>::createProxy(const cbtVector3& aabbMin, const cbtVector3& aabbMax, int shapeType, void* userPtr, int collisionFilterGroup, int collisionFilterMask, cbtDispatcher* dispatcher)
{
	(void)shapeType;
	BP_FP_INT_TYPE handleId = addHandle(aabbMin, aabbMax, userPtr, collisionFilterGroup, collisionFilterMask, dispatcher);

	Handle* handle = getHandle(handleId);

	if (m_raycastAccelerator)
	{
		cbtBroadphaseProxy* rayProxy = m_raycastAccelerator->createProxy(aabbMin, aabbMax, shapeType, userPtr, collisionFilterGroup, collisionFilterMask, dispatcher);
		handle->m_dbvtProxy = rayProxy;
	}
	return handle;
}